

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void deleteTable(sqlite3 *db,Table *pTable)

{
  Index *pIVar1;
  FKey *pFVar2;
  void *p;
  FKey *pFVar3;
  Index *p_00;
  FKey *p_01;
  long lVar4;
  
  p_00 = pTable->pIndex;
  while (p_00 != (Index *)0x0) {
    pIVar1 = p_00->pNext;
    if (((db == (sqlite3 *)0x0) || (db->pnBytesFreed == (int *)0x0)) && (pTable->eTabType != '\x01')
       ) {
      sqlite3HashInsert(&p_00->pSchema->idxHash,p_00->zName,(void *)0x0);
    }
    sqlite3FreeIndex(db,p_00);
    p_00 = pIVar1;
  }
  if (pTable->eTabType == '\x01') {
    if ((db == (sqlite3 *)0x0) || (db->pnBytesFreed == (int *)0x0)) {
      vtabDisconnectAll((sqlite3 *)0x0,pTable);
    }
    if ((pTable->u).tab.pFKey != (FKey *)0x0) {
      for (lVar4 = 0; lVar4 < (pTable->u).tab.addColOffset; lVar4 = lVar4 + 1) {
        if (lVar4 != 1) {
          sqlite3DbFree(db,*(void **)(((pTable->u).tab.pFKey)->aAction + lVar4 * 8 + -0x2d));
        }
      }
      sqlite3DbFree(db,(pTable->u).tab.pFKey);
    }
  }
  else if (pTable->eTabType == '\0') {
    p_01 = (pTable->u).tab.pFKey;
    while (p_01 != (FKey *)0x0) {
      if ((db == (sqlite3 *)0x0) || (db->pnBytesFreed == (int *)0x0)) {
        pFVar3 = p_01->pNextTo;
        if (p_01->pPrevTo == (FKey *)0x0) {
          pFVar2 = pFVar3;
          if (pFVar3 == (FKey *)0x0) {
            pFVar2 = p_01;
          }
          sqlite3HashInsert(&pTable->pSchema->fkeyHash,pFVar2->zTo,pFVar3);
          pFVar3 = p_01->pNextTo;
        }
        else {
          p_01->pPrevTo->pNextTo = pFVar3;
        }
        if (pFVar3 != (FKey *)0x0) {
          pFVar3->pPrevTo = p_01->pPrevTo;
        }
      }
      fkTriggerDelete(db,p_01->apTrigger[0]);
      fkTriggerDelete(db,p_01->apTrigger[1]);
      pFVar3 = p_01->pNextFrom;
      sqlite3DbFreeNN(db,p_01);
      p_01 = pFVar3;
    }
  }
  else {
    sqlite3SelectDelete(db,(pTable->u).view.pSelect);
  }
  sqlite3DeleteColumnNames(db,pTable);
  sqlite3DbFree(db,pTable->zName);
  sqlite3DbFree(db,pTable->zColAff);
  sqlite3ExprListDelete(db,pTable->pCheck);
  sqlite3DbFreeNN(db,pTable);
  return;
}

Assistant:

static void SQLITE_NOINLINE deleteTable(sqlite3 *db, Table *pTable){
  Index *pIndex, *pNext;

#ifdef SQLITE_DEBUG
  /* Record the number of outstanding lookaside allocations in schema Tables
  ** prior to doing any free() operations. Since schema Tables do not use
  ** lookaside, this number should not change.
  **
  ** If malloc has already failed, it may be that it failed while allocating
  ** a Table object that was going to be marked ephemeral. So do not check
  ** that no lookaside memory is used in this case either. */
  int nLookaside = 0;
  if( db && !db->mallocFailed && (pTable->tabFlags & TF_Ephemeral)==0 ){
    nLookaside = sqlite3LookasideUsed(db, 0);
  }
#endif

  /* Delete all indices associated with this table. */
  for(pIndex = pTable->pIndex; pIndex; pIndex=pNext){
    pNext = pIndex->pNext;
    assert( pIndex->pSchema==pTable->pSchema
         || (IsVirtual(pTable) && pIndex->idxType!=SQLITE_IDXTYPE_APPDEF) );
    if( (db==0 || db->pnBytesFreed==0) && !IsVirtual(pTable) ){
      char *zName = pIndex->zName;
      TESTONLY ( Index *pOld = ) sqlite3HashInsert(
         &pIndex->pSchema->idxHash, zName, 0
      );
      assert( db==0 || sqlite3SchemaMutexHeld(db, 0, pIndex->pSchema) );
      assert( pOld==pIndex || pOld==0 );
    }
    sqlite3FreeIndex(db, pIndex);
  }

  if( IsOrdinaryTable(pTable) ){
    sqlite3FkDelete(db, pTable);
  }
#ifndef SQLITE_OMIT_VIRTUAL_TABLE
  else if( IsVirtual(pTable) ){
    sqlite3VtabClear(db, pTable);
  }
#endif
  else{
    assert( IsView(pTable) );
    sqlite3SelectDelete(db, pTable->u.view.pSelect);
  }